

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_struct_definition
          (t_netstd_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool in_class,
          bool is_result)

{
  int *piVar1;
  byte bVar2;
  iterator iVar3;
  ostream *poVar4;
  t_type *type;
  undefined7 in_register_00000009;
  t_field *ptVar5;
  pointer pptVar6;
  bool bVar7;
  char *pcVar8;
  t_netstd_generator *ptVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  t_struct *ptVar10;
  bool bVar11;
  string local_1f0;
  t_struct *local_1d0;
  undefined4 local_1c8;
  byte local_1c4;
  undefined3 uStack_1c3;
  pointer local_1c0;
  string local_1b8;
  int local_198;
  undefined4 local_194;
  string sharp_struct_name;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_194 = (undefined4)CONCAT71(in_register_00000089,is_result);
  local_1c8 = (undefined4)CONCAT71(in_register_00000009,is_exception);
  local_198 = (int)CONCAT71(in_register_00000081,in_class);
  if (local_198 == 0) {
    start_netstd_namespace(this,out);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  generate_netstd_doc(this,out,(t_doc *)tstruct);
  collect_extensions_types(this,tstruct);
  prepare_member_name_mapping(this,tstruct);
  if (this->serialize_ == false) {
    if (this->wcf_ != true || (byte)local_1c8 != '\0') goto LAB_00246e70;
  }
  else if ((byte)local_1c8 != '\0') goto LAB_00246e70;
  t_generator::indent_abi_cxx11_(&sharp_struct_name,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&sharp_struct_name);
  poVar4 = std::operator<<(poVar4,"[DataContract(Namespace=\"");
  poVar4 = std::operator<<(poVar4,(string *)&this->wcf_namespace_);
  poVar4 = std::operator<<(poVar4,"\")]");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sharp_struct_name);
LAB_00246e70:
  std::__cxx11::string::string((string *)&sharp_struct_name,"final",(allocator *)&local_1f0);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(tstruct->super_t_type).annotations_._M_t,&sharp_struct_name);
  std::__cxx11::string::~string((string *)&sharp_struct_name);
  type_name_abi_cxx11_(&sharp_struct_name,this,&tstruct->super_t_type,false);
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1f0);
  poVar4 = std::operator<<(poVar4,"public ");
  pcVar8 = "sealed ";
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(tstruct->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header) {
    pcVar8 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar8);
  poVar4 = std::operator<<(poVar4,"partial class ");
  poVar4 = std::operator<<(poVar4,(string *)&sharp_struct_name);
  std::operator<<(poVar4," : ");
  std::__cxx11::string::~string((string *)&local_1f0);
  if ((byte)local_1c8 != '\0') {
    std::operator<<(out,"TException, ");
  }
  poVar4 = std::operator<<(out,"TBase");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_1f0);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1f0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  local_1d0 = tstruct;
  for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    if ((*pptVar6)->req_ != T_REQUIRED) {
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_1f0);
      poVar4 = std::operator<<(poVar4,"private ");
      ptVar5 = *pptVar6;
      std::__cxx11::string::string((string *)&local_50,"_",(allocator *)&local_170);
      declare_field(&local_1b8,this,ptVar5,false,&local_50);
      poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  pptVar6 = (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1c4 = 0;
  uStack_1c3 = 0;
  bVar7 = false;
  for (; pptVar6 !=
         (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    generate_netstd_doc(this,out,*pptVar6);
    generate_property(this,out,*pptVar6,true,true);
    bVar11 = (*pptVar6)->req_ == T_REQUIRED;
    local_1c4 = local_1c4 | bVar11;
    bVar7 = (bool)(bVar7 | !bVar11);
  }
  ptVar10 = local_1d0;
  if (bVar7) {
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    if ((this->serialize_ != false) || (this->wcf_ == true)) {
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_1f0);
      poVar4 = std::operator<<(poVar4,"[DataMember(Order = 1)]");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1f0);
    poVar4 = std::operator<<(poVar4,"public Isset __isset;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f0);
    if ((this->serialize_ != false) || (this->wcf_ == true)) {
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_1f0);
      poVar4 = std::operator<<(poVar4,"[DataContract]");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1f0);
    poVar4 = std::operator<<(poVar4,"public struct Isset");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
    poVar4 = std::operator<<(poVar4,"{");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1f0);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    for (pptVar6 = (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar6 !=
        (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      if ((*pptVar6)->req_ != T_REQUIRED) {
        if ((this->serialize_ != false) || (this->wcf_ == true)) {
          t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
          poVar4 = std::operator<<(out,(string *)&local_1f0);
          poVar4 = std::operator<<(poVar4,"[DataMember]");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_1f0);
        }
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_1f0);
        poVar4 = std::operator<<(poVar4,"public bool ");
        std::__cxx11::string::string((string *)&local_70,(string *)&(*pptVar6)->name_);
        ptVar9 = this;
        normalize_name(&local_170,this,&local_70,false);
        get_isset_name(&local_1b8,ptVar9,&local_170);
        poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
        poVar4 = std::operator<<(poVar4,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1f0);
    ptVar10 = local_1d0;
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f0);
    if ((this->serialize_ != false) || (this->wcf_ == true)) {
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_1f0);
      poVar4 = std::operator<<(poVar4,"#region XmlSerializer support");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1f0);
      for (pptVar6 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar6 !=
          (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
        if ((*pptVar6)->req_ != T_REQUIRED) {
          t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
          poVar4 = std::operator<<(out,(string *)&local_1f0);
          poVar4 = std::operator<<(poVar4,"public bool ShouldSerialize");
          prop_name_abi_cxx11_(&local_1b8,this,*pptVar6,false);
          poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
          poVar4 = std::operator<<(poVar4,"()");
          poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
          poVar4 = std::operator<<(poVar4,(string *)&local_170);
          poVar4 = std::operator<<(poVar4,"{");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1f0);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
          poVar4 = std::operator<<(out,(string *)&local_1f0);
          poVar4 = std::operator<<(poVar4,"return __isset.");
          std::__cxx11::string::string((string *)&local_110,(string *)&(*pptVar6)->name_);
          ptVar9 = this;
          normalize_name(&local_170,this,&local_110,false);
          get_isset_name(&local_1b8,ptVar9,&local_170);
          poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
          poVar4 = std::operator<<(poVar4,";");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_1f0);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
          poVar4 = std::operator<<(out,(string *)&local_1f0);
          poVar4 = std::operator<<(poVar4,"}");
          poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_1f0);
        }
      }
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_1f0);
      ptVar10 = local_1d0;
      poVar4 = std::operator<<(poVar4,"#endregion XmlSerializer support");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
  }
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1f0);
  poVar4 = std::operator<<(poVar4,"public ");
  poVar4 = std::operator<<(poVar4,(string *)&sharp_struct_name);
  poVar4 = std::operator<<(poVar4,"()");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1f0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar6 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (pptVar6 !=
         (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    type = resolve_typedef((*pptVar6)->type_);
    ptVar5 = *pptVar6;
    local_1c0 = pptVar6;
    if (ptVar5->value_ != (t_const_value *)0x0) {
      if (ptVar5->req_ == T_REQUIRED) {
        prop_name_abi_cxx11_(&local_1f0,this,ptVar5,false);
        __return_storage_ptr__ = &local_90;
        std::operator+(__return_storage_ptr__,"this.",&local_1f0);
        print_const_value(this,out,__return_storage_ptr__,type,(*local_1c0)->value_,true,true,false)
        ;
      }
      else {
        std::operator+(&local_130,"this._",&ptVar5->name_);
        print_const_value(this,out,&local_130,type,(*local_1c0)->value_,true,true,false);
        std::__cxx11::string::~string((string *)&local_130);
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_1f0);
        poVar4 = std::operator<<(poVar4,"this.__isset.");
        std::__cxx11::string::string((string *)&local_b0,(string *)&(*local_1c0)->name_);
        ptVar9 = this;
        normalize_name(&local_170,this,&local_b0,false);
        get_isset_name(&local_1b8,ptVar9,&local_170);
        poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
        poVar4 = std::operator<<(poVar4," = true;");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_170);
        __return_storage_ptr__ = &local_b0;
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    pptVar6 = local_1c0 + 1;
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1f0);
  ptVar10 = local_1d0;
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1f0);
  if ((local_1c4 & 1) != 0) {
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1f0);
    poVar4 = std::operator<<(poVar4,"public ");
    poVar4 = std::operator<<(poVar4,(string *)&sharp_struct_name);
    std::operator<<(poVar4,"(");
    std::__cxx11::string::~string((string *)&local_1f0);
    bVar7 = true;
    for (pptVar6 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar6 !=
        (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      ptVar5 = *pptVar6;
      if (ptVar5->req_ == T_REQUIRED) {
        if (!bVar7) {
          std::operator<<(out,", ");
          ptVar5 = *pptVar6;
        }
        type_name_abi_cxx11_(&local_1f0,this,ptVar5->type_,true);
        poVar4 = std::operator<<(out,(string *)&local_1f0);
        poVar4 = std::operator<<(poVar4," ");
        std::__cxx11::string::string((string *)&local_d0,(string *)&(*pptVar6)->name_);
        normalize_name(&local_1b8,this,&local_d0,false);
        std::operator<<(poVar4,(string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        bVar7 = false;
      }
    }
    poVar4 = std::operator<<(out,") : this()");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    ptVar10 = local_1d0;
    poVar4 = std::operator<<(poVar4,(string *)&local_1f0);
    poVar4 = std::operator<<(poVar4,"{");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f0);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    for (pptVar6 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar6 !=
        (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      if ((*pptVar6)->req_ == T_REQUIRED) {
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_1f0);
        poVar4 = std::operator<<(poVar4,"this.");
        prop_name_abi_cxx11_(&local_1b8,this,*pptVar6,false);
        poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
        poVar4 = std::operator<<(poVar4," = ");
        std::__cxx11::string::string((string *)&local_f0,(string *)&(*pptVar6)->name_);
        normalize_name(&local_170,this,&local_f0,false);
        poVar4 = std::operator<<(poVar4,(string *)&local_170);
        poVar4 = std::operator<<(poVar4,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1f0);
    ptVar10 = local_1d0;
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::__cxx11::string::string((string *)&local_150,(string *)&sharp_struct_name);
  generate_netstd_deepcopy_method(this,out,ptVar10,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  generate_netstd_struct_reader(this,out,ptVar10);
  if ((char)local_194 == '\0') {
    generate_netstd_struct_writer(this,out,ptVar10);
  }
  else {
    generate_netstd_struct_result_writer(this,out,ptVar10);
  }
  generate_netstd_struct_equals(this,out,ptVar10);
  generate_netstd_struct_hashcode(this,out,ptVar10);
  generate_netstd_struct_tostring(this,out,ptVar10);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1f0);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1f0);
  bVar2 = (byte)local_1c8;
  if (this->serialize_ == false) {
    bVar2 = this->wcf_ & (byte)local_1c8;
  }
  if (bVar2 != 0) {
    generate_netstd_wcffault(this,out,ptVar10);
  }
  cleanup_member_name_mapping(this,ptVar10);
  if ((char)local_198 == '\0') {
    end_netstd_namespace(this,out);
  }
  std::__cxx11::string::~string((string *)&sharp_struct_name);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_definition(ostream& out, t_struct* tstruct, bool is_exception, bool in_class, bool is_result)
{
    if (!in_class)
    {
        start_netstd_namespace(out);
    }

    out << endl;

    generate_netstd_doc(out, tstruct);
    collect_extensions_types(tstruct);
    prepare_member_name_mapping(tstruct);

    if ((is_serialize_enabled() || is_wcf_enabled()) && !is_exception)
    {
        out << indent() << "[DataContract(Namespace=\"" << wcf_namespace_ << "\")]" << endl;
    }

    bool is_final = tstruct->annotations_.find("final") != tstruct->annotations_.end();

    string sharp_struct_name = type_name(tstruct, false);

    out << indent() << "public " << (is_final ? "sealed " : "") << "partial class " << sharp_struct_name << " : ";

    if (is_exception)
    {
        out << "TException, ";
    }

    out << "TBase" << endl
        << indent() << "{" << endl;
    indent_up();

    const vector<t_field*>& members = tstruct->get_members();
    vector<t_field*>::const_iterator m_iter;

    // make private members with public Properties
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        // if the field is required, then we use auto-properties
        if (!field_is_required((*m_iter)))
        {
            out << indent() << "private " << declare_field(*m_iter, false, "_") << endl;
        }
    }
    out << endl;

    bool has_non_required_fields = false;
    bool has_required_fields = false;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        generate_netstd_doc(out, *m_iter);
        generate_property(out, *m_iter, true, true);
        bool is_required = field_is_required((*m_iter));
        if (is_required)
        {
            has_required_fields = true;
    }
        else
        {
            has_non_required_fields = true;
        }
    }

    bool generate_isset = has_non_required_fields;
    if (generate_isset)
    {
        out << endl;
        if (is_serialize_enabled() || is_wcf_enabled())
        {
            out << indent() << "[DataMember(Order = 1)]" << endl;
        }
        out << indent() << "public Isset __isset;" << endl;
        if (is_serialize_enabled() || is_wcf_enabled())
        {
            out << indent() << "[DataContract]" << endl;
        }

        out << indent() << "public struct Isset" << endl
            << indent() << "{" << endl;
        indent_up();

        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            bool is_required = field_is_required((*m_iter));
            // if it is required, don't need Isset for that variable
            // if it is not required, if it has a default value, we need to generate Isset
            if (!is_required)
            {
                if (is_serialize_enabled() || is_wcf_enabled())
                {
                    out << indent() << "[DataMember]" << endl;
                }
                out << indent() << "public bool " << get_isset_name(normalize_name((*m_iter)->get_name())) << ";" << endl;
            }
        }

        indent_down();
        out << indent() << "}" << endl << endl;

        if (generate_isset && (is_serialize_enabled() || is_wcf_enabled()))
        {
            out << indent() << "#region XmlSerializer support" << endl << endl;

            for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
            {
                bool is_required = field_is_required(*m_iter);
                // if it is required, don't need Isset for that variable
                // if it is not required, if it has a default value, we need to generate Isset
                if (!is_required)
                {
                    out << indent() << "public bool ShouldSerialize" << prop_name(*m_iter) << "()" << endl
                        << indent() << "{" << endl;
                    indent_up();
                    out << indent() << "return __isset." << get_isset_name(normalize_name((*m_iter)->get_name())) << ";" << endl;
                    indent_down();
                    out << indent() << "}" << endl << endl;
                }
            }

            out << indent() << "#endregion XmlSerializer support" << endl << endl;
        }
    }

    // We always want a default, no argument constructor for Reading
    out << indent() << "public " << sharp_struct_name << "()" << endl
        << indent() << "{" << endl;
    indent_up();

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        t_type* t = (*m_iter)->get_type();
        t = resolve_typedef(t);

        if ((*m_iter)->get_value() != nullptr)
        {
            if (field_is_required((*m_iter)))
            {
                print_const_value(out, "this." + prop_name(*m_iter), t, (*m_iter)->get_value(), true, true);
            }
            else
            {
                print_const_value(out, "this._" + (*m_iter)->get_name(), t, (*m_iter)->get_value(), true, true);
                // Optionals with defaults are marked set
                out << indent() << "this.__isset." << get_isset_name(normalize_name((*m_iter)->get_name())) << " = true;" << endl;
            }
        }
    }
    indent_down();
    out << indent() << "}" << endl << endl;

    // if we have required fields, we add that CTOR too
    if (has_required_fields)
    {
        out << indent() << "public " << sharp_struct_name << "(";
        bool first = true;
        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            if (field_is_required(*m_iter))
            {
                if (first)
                {
                    first = false;
                }
                else
                {
                    out << ", ";
                }
                out << type_name((*m_iter)->get_type()) << " " << normalize_name((*m_iter)->get_name());
            }
        }
        out << ") : this()" << endl
            << indent() << "{" << endl;
        indent_up();

        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            if (field_is_required(*m_iter))
            {
                out << indent() << "this." << prop_name(*m_iter) << " = " << normalize_name((*m_iter)->get_name()) << ";" << endl;
            }
        }

        indent_down();
        out << indent() << "}" << endl << endl;
    }

    // DeepCopy()
    generate_netstd_deepcopy_method(out, tstruct, sharp_struct_name);

    generate_netstd_struct_reader(out, tstruct);
    if (is_result)
    {
        generate_netstd_struct_result_writer(out, tstruct);
    }
    else
    {
        generate_netstd_struct_writer(out, tstruct);
    }
    generate_netstd_struct_equals(out, tstruct);
    generate_netstd_struct_hashcode(out, tstruct);
    generate_netstd_struct_tostring(out, tstruct);

    indent_down();
    out << indent() << "}" << endl << endl;

    // generate a corresponding WCF fault to wrap the exception
    if ((is_serialize_enabled() || is_wcf_enabled()) && is_exception)
    {
        generate_netstd_wcffault(out, tstruct);
    }

    cleanup_member_name_mapping(tstruct);
    if (!in_class)
    {
        end_netstd_namespace(out);
    }
}